

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-tree.c
# Opt level: O3

nametree_entry_t * nametree_find_or_insert_try(ndn_nametree_t *nametree,uint8_t *name,size_t len)

{
  uint8_t *__s1;
  ushort uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  nametree_entry_t *pnVar8;
  long lVar9;
  size_t __n;
  ulong uVar10;
  undefined2 local_32;
  
  if (len < 2) {
LAB_00113cd0:
    pnVar8 = (nametree_entry_t *)0x0;
  }
  else {
    uVar7 = (ulong)(0xfc < name[1]) * 2 + 2;
    uVar4 = 0;
    if (uVar7 < len) {
      uVar4 = 0;
      do {
        __s1 = name + uVar7;
        uVar5 = (ulong)name[uVar7 + 1] + 2;
        __n = 0x24;
        if (uVar5 < 0x24) {
          __n = uVar5;
        }
        lVar6 = uVar4 * 0x2e;
        uVar4 = (ulong)*(ushort *)(nametree + lVar6 + 0x26);
        if (*(ushort *)(nametree + lVar6 + 0x26) == 0xffff) {
          local_32 = 0xffff;
          uVar10 = 0xffff;
LAB_00113db5:
          uVar1 = *(ushort *)(nametree + 0x28);
          uVar4 = (ulong)uVar1;
          if (uVar1 == 0xffff) goto LAB_00113cd0;
          lVar9 = uVar4 * 0x2e;
          *(undefined2 *)(nametree + 0x28) = *(undefined2 *)(nametree + lVar9 + 0x28);
          *(undefined8 *)(nametree + lVar9 + 0x26) = 0xffffffffffffffff;
          memcpy(nametree + lVar9,__s1,__n);
          lVar2 = uVar10 * 0x2e + 0x28;
          if ((int)uVar10 == 0xffff) {
            lVar2 = lVar6 + 0x26;
          }
          *(ushort *)(nametree + lVar2) = uVar1;
          *(undefined2 *)(nametree + lVar9 + 0x28) = local_32;
        }
        else {
          iVar3 = memcmp(__s1,nametree + uVar4 * 0x2e,__n);
          if (iVar3 < 1) {
            uVar10 = 0xffff;
          }
          else {
            local_32 = 0xffff;
            do {
              uVar10 = uVar4;
              uVar4 = (ulong)*(ushort *)(nametree + uVar10 * 0x2e + 0x28);
              if (*(ushort *)(nametree + uVar10 * 0x2e + 0x28) == 0xffff) goto LAB_00113db5;
              iVar3 = memcmp(__s1,nametree + uVar4 * 0x2e,__n);
            } while (0 < iVar3);
          }
          local_32 = (undefined2)uVar4;
          if (iVar3 != 0) goto LAB_00113db5;
        }
        uVar7 = uVar7 + uVar5;
      } while (uVar7 < len);
    }
    pnVar8 = (nametree_entry_t *)(nametree + uVar4 * 0x2e);
  }
  return pnVar8;
}

Assistant:

static nametree_entry_t*
nametree_find_or_insert_try(ndn_nametree_t *nametree, uint8_t name[], size_t len)
{
  int now_node, last_node, father = 0 , tmp , new_node_number;
  size_t component_len, eqiv_component_len, offset = 0;
  // TODO: Put it into decoder
  if (len < 2) return NULL;
  if (name[1] < 253) offset = 2; else offset = 4;
  while (offset < len) {
    component_len = name[offset + 1] + 2;
    eqiv_component_len = minof2(component_len, NDN_NAME_COMPONENT_BUFFER_SIZE);
    now_node = (*nametree)[father].left_child;
    last_node = NDN_INVALID_ID;
    tmp = -2;
    while (now_node != NDN_INVALID_ID) {
      tmp = memcmp(name+offset, (*nametree)[now_node].val , eqiv_component_len);
      if (tmp <= 0) break;
      last_node = now_node;
      now_node = (*nametree)[now_node].right_bro;
    }
    if (tmp != 0) {
      new_node_number = nametree_create_node(nametree, name + offset , eqiv_component_len);
      if (new_node_number == NDN_INVALID_ID) return NULL;
      if(last_node == NDN_INVALID_ID){
        (*nametree)[father].left_child = new_node_number;
      }else{
        (*nametree)[last_node].right_bro = new_node_number;
      }
      (*nametree)[new_node_number].right_bro = now_node;
      now_node = new_node_number;
    }
    offset += component_len;
    father = now_node;
  }
  return &(*nametree)[father];
}